

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QPainterPath * __thiscall QGraphicsPixmapItem::shape(QGraphicsPixmapItem *this)

{
  QGraphicsPixmapItemPrivate *pQVar1;
  QPainterPath *in_RDI;
  QGraphicsPixmapItemPrivate *unaff_retaddr;
  QGraphicsPixmapItemPrivate *thatD;
  QGraphicsPixmapItemPrivate *d;
  
  pQVar1 = d_func((QGraphicsPixmapItem *)0x98b05d);
  if ((pQVar1->hasShape & 1U) == 0) {
    QGraphicsPixmapItemPrivate::updateShape(unaff_retaddr);
    pQVar1->hasShape = true;
  }
  pQVar1 = d_func((QGraphicsPixmapItem *)0x98b09a);
  QPainterPath::QPainterPath(in_RDI,&pQVar1->shape);
  return in_RDI;
}

Assistant:

QPainterPath QGraphicsPixmapItem::shape() const
{
    Q_D(const QGraphicsPixmapItem);
    if (!d->hasShape) {
        QGraphicsPixmapItemPrivate *thatD = const_cast<QGraphicsPixmapItemPrivate *>(d);
        thatD->updateShape();
        thatD->hasShape = true;
    }
    return d_func()->shape;
}